

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_feature_helper.cc
# Opt level: O0

FeatureSet * __thiscall
google::protobuf::internal::InternalFeatureHelper::ParseAndGetEditionResolvedFeatureSet
          (FeatureSet *__return_storage_ptr__,InternalFeatureHelper *this,string_view data,
          Edition edition)

{
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  FeatureSet *from;
  Nonnull<std::string_*> dest;
  string_view src;
  Status *local_198;
  LogMessage local_158;
  Voidify local_141;
  undefined1 local_140 [8];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  StatusOr<google::protobuf::FeatureSet> edition_feature_set;
  LogMessage local_d0;
  Voidify local_b9;
  string_view local_b8;
  InternalFeatureHelper *local_98;
  size_t sStack_90;
  string local_80 [8];
  string unescaped_data;
  FeatureSetDefaults defaults;
  Edition edition_local;
  string_view data_local;
  
  dest = (Nonnull<std::string_*>)data._M_str;
  FeatureSetDefaults::FeatureSetDefaults((FeatureSetDefaults *)((long)&unescaped_data.field_2 + 8));
  std::__cxx11::string::string(local_80);
  src._M_str = (char *)local_80;
  src._M_len = data._M_len;
  local_98 = this;
  sStack_90 = data._M_len;
  absl::lts_20250127::Base64Unescape((lts_20250127 *)this,src,dest);
  local_b8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_80);
  bVar1 = MessageLite::ParseFromString((MessageLite *)((long)&unescaped_data.field_2 + 8),local_b8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper.cc"
               ,0x15,"defaults.ParseFromString(unescaped_data)");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_b9,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d0);
  }
  GetEditionFeatureSetDefaults
            ((StatusOr<google::protobuf::FeatureSet> *)&absl_log_internal_check_ok_goo.second,
             (Edition)data._M_str,(FeatureSetDefaults *)((long)&unescaped_data.field_2 + 8));
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)local_140);
  local_140 = (undefined1  [8])
              absl::lts_20250127::log_internal::AsStatus<google::protobuf::FeatureSet>
                        ((StatusOr<google::protobuf::FeatureSet> *)
                         &absl_log_internal_check_ok_goo.second);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_140);
  if (bVar1) {
    local_198 = (Status *)0x0;
  }
  else {
    local_198 = (Status *)
                absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_140,"edition_feature_set is OK");
  }
  absl_log_internal_check_ok_goo.first = local_198;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_140);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper.cc"
               ,0x17,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_158);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_141,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_158);
  }
  from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::operator*
                   ((StatusOr<google::protobuf::FeatureSet> *)&absl_log_internal_check_ok_goo.second
                   );
  FeatureSet::FeatureSet(__return_storage_ptr__,from);
  absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::~StatusOr
            ((StatusOr<google::protobuf::FeatureSet> *)&absl_log_internal_check_ok_goo.second);
  std::__cxx11::string::~string(local_80);
  FeatureSetDefaults::~FeatureSetDefaults((FeatureSetDefaults *)((long)&unescaped_data.field_2 + 8))
  ;
  return __return_storage_ptr__;
}

Assistant:

FeatureSet InternalFeatureHelper::ParseAndGetEditionResolvedFeatureSet(
    absl::string_view data, Edition edition) {
  FeatureSetDefaults defaults;
  std::string unescaped_data;
  absl::Base64Unescape(data, &unescaped_data);
  ABSL_CHECK(defaults.ParseFromString(unescaped_data));
  auto edition_feature_set = GetEditionFeatureSetDefaults(edition, defaults);
  ABSL_CHECK_OK(edition_feature_set);
  return *edition_feature_set;
}